

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryOptimizer.cpp
# Opt level: O0

Query * simplify_minof(Query *q,bool *changed)

{
  uint32_t uVar1;
  QueryType *pQVar2;
  vector<Query,_std::allocator<Query>_> *this;
  Query *pQVar3;
  undefined1 *in_RDX;
  Query *in_RSI;
  Query *in_RDI;
  Query *in_stack_fffffffffffffef8;
  Query *queries;
  Query *in_stack_ffffffffffffff10;
  
  queries = in_RDI;
  pQVar2 = Query::get_type(in_RSI);
  if (*pQVar2 == MIN_OF) {
    uVar1 = Query::as_count(in_RSI);
    in_stack_fffffffffffffef8 = (Query *)(ulong)uVar1;
    this = Query::as_queries(in_stack_ffffffffffffff10);
    pQVar3 = (Query *)std::vector<Query,_std::allocator<Query>_>::size(this);
    if (in_stack_fffffffffffffef8 == pQVar3) {
      *in_RDX = 1;
      Query::as_queries(in_stack_ffffffffffffff10);
      q_and((vector<Query,_std::allocator<Query>_> *)queries);
      Query::Query(in_RDI,in_stack_fffffffffffffef8);
      Query::~Query(in_RDI);
      return queries;
    }
    uVar1 = Query::as_count(in_RSI);
    if (uVar1 == 1) {
      *in_RDX = 1;
      Query::as_queries(in_stack_ffffffffffffff10);
      q_or((vector<Query,_std::allocator<Query>_> *)queries);
      Query::Query(in_RDI,in_stack_fffffffffffffef8);
      Query::~Query(in_RDI);
      return queries;
    }
    uVar1 = Query::as_count(in_RSI);
    if (uVar1 == 0) {
      *in_RDX = 1;
      q_everything();
      Query::Query(in_RDI,in_stack_fffffffffffffef8);
      Query::~Query(in_RDI);
      return queries;
    }
  }
  Query::Query(in_RDI,in_stack_fffffffffffffef8);
  return queries;
}

Assistant:

Query simplify_minof(Query &&q, bool *changed) {
    if (q.get_type() == QueryType::MIN_OF) {
        if (q.as_count() == q.as_queries().size()) {
            *changed = true;
            return std::move(q_and(std::move(q.as_queries())));
        } else if (q.as_count() == 1) {
            *changed = true;
            return std::move(q_or(std::move(q.as_queries())));
        } else if (q.as_count() == 0) {
            *changed = true;
            return std::move(q_everything());
        }
    }
    return std::move(q);
}